

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool intersection(Segment *segment,BoundingBox *box)

{
  Point *pPVar1;
  float fVar2;
  undefined8 uVar3;
  float *pfVar4;
  float *pfVar5;
  Point PVar6;
  float tmax;
  float tmin;
  float t6;
  float t5;
  float t4;
  float t3;
  float t2;
  float t1;
  float dirfracZ;
  float dirfracY;
  float dirfracX;
  float local_70;
  Point local_68;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Vector local_38;
  undefined8 local_2c;
  Vector dir;
  BoundingBox *box_local;
  Segment *segment_local;
  
  local_50 = (segment->b).z;
  pPVar1 = &segment->b;
  local_58._0_4_ = pPVar1->x;
  local_58._4_4_ = pPVar1->y;
  local_48 = local_58;
  local_40 = local_50;
  dir._4_8_ = box;
  PVar6 = operator-(*pPVar1,&segment->a);
  local_68.z = PVar6.z;
  local_38.z = local_68.z;
  local_68._0_8_ = PVar6._0_8_;
  local_38.x = local_68.x;
  local_38.y = local_68.y;
  local_68 = PVar6;
  _dirfracY = normalize(&local_38);
  local_2c = _dirfracY;
  uVar3 = local_2c;
  dir.x = local_70;
  local_2c._0_4_ = dirfracY;
  dirfracZ = 1.0 / (float)local_2c;
  local_2c._4_4_ = dirfracY._4_4_;
  t1 = 1.0 / local_2c._4_4_;
  t2 = 1.0 / local_70;
  t3 = (*(float *)dir._4_8_ - (segment->a).x) * dirfracZ;
  t4 = (*(float *)(dir._4_8_ + 0xc) - (segment->a).x) * dirfracZ;
  t5 = (*(float *)(dir._4_8_ + 4) - (segment->a).y) * t1;
  t6 = (*(float *)(dir._4_8_ + 0x10) - (segment->a).y) * t1;
  tmin = (*(float *)(dir._4_8_ + 8) - (segment->a).z) * t2;
  tmax = (*(float *)(dir._4_8_ + 0x14) - (segment->a).z) * t2;
  local_2c = uVar3;
  pfVar4 = std::min<float>(&t3,&t4);
  pfVar5 = std::min<float>(&t5,&t6);
  pfVar4 = std::max<float>(pfVar4,pfVar5);
  pfVar5 = std::min<float>(&tmin,&tmax);
  pfVar4 = std::max<float>(pfVar4,pfVar5);
  fVar2 = *pfVar4;
  pfVar4 = std::max<float>(&t3,&t4);
  pfVar5 = std::max<float>(&t5,&t6);
  pfVar4 = std::min<float>(pfVar4,pfVar5);
  pfVar5 = std::max<float>(&tmin,&tmax);
  pfVar4 = std::min<float>(pfVar4,pfVar5);
  if (0.0 <= *pfVar4) {
    if (fVar2 <= *pfVar4) {
      segment_local._7_1_ = true;
    }
    else {
      segment_local._7_1_ = false;
    }
  }
  else {
    segment_local._7_1_ = false;
  }
  return segment_local._7_1_;
}

Assistant:

bool intersection(Segment const& segment, BoundingBox const& box)
{
  Vector dir = normalize(segment.b - segment.a);
  float dirfracX;
  float dirfracY;
  float dirfracZ;
  dirfracX = 1.0f / dir.x;
  dirfracY = 1.0f / dir.y;
  dirfracZ = 1.0f / dir.z;

  float t1 = (box.vMin.x - segment.a.x) * dirfracX;
  float t2 = (box.vMax.x - segment.a.x) * dirfracX;
  float t3 = (box.vMin.y - segment.a.y) * dirfracY;
  float t4 = (box.vMax.y - segment.a.y) * dirfracY;
  float t5 = (box.vMin.z - segment.a.z) * dirfracZ;
  float t6 = (box.vMax.z - segment.a.z) * dirfracZ;

  float tmin = std::max(std::max(std::min(t1, t2), std::min(t3, t4)), std::min(t5, t6));
  float tmax = std::min(std::min(std::max(t1, t2), std::max(t3, t4)), std::max(t5, t6));

  if (tmax < 0)
  {
    return false;
  }

  if (tmin > tmax)
  {
    return false;
  }
  return true;
}